

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

char * lws_sql_purify(char *escaped,char *string,size_t len)

{
  char cVar1;
  char *pcVar2;
  char *p;
  char *q;
  char *pcVar3;
  
  pcVar2 = escaped;
  while ((cVar1 = *string, cVar1 != '\0' && (2 < len))) {
    if (cVar1 == '\'') {
      pcVar3 = pcVar2 + 2;
      pcVar2[1] = '\'';
      len = len - 2;
    }
    else {
      len = len - 1;
      pcVar3 = pcVar2 + 1;
    }
    *pcVar2 = cVar1;
    string = string + 1;
    pcVar2 = pcVar3;
  }
  *pcVar2 = '\0';
  return escaped;
}

Assistant:

const char *
lws_sql_purify(char *escaped, const char *string, size_t len)
{
	const char *p = string;
	char *q = escaped;

	while (*p && len-- > 2) {
		if (*p == '\'') {
			*q++ = '\'';
			*q++ = '\'';
			len --;
			p++;
		} else
			*q++ = *p++;
	}
	*q = '\0';

	return escaped;
}